

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetMetricGroupGetProperties
          (zet_metric_group_handle_t hMetricGroup,zet_metric_group_properties_t *pProperties)

{
  zet_pfnMetricGroupGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zet_metric_group_properties_t *pProperties_local;
  zet_metric_group_handle_t hMetricGroup_local;
  
  if (*(code **)(*(long *)(hMetricGroup + 8) + 0x758) == (code *)0x0) {
    hMetricGroup_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hMetricGroup_local._4_4_ =
         (**(code **)(*(long *)(hMetricGroup + 8) + 0x758))(*(undefined8 *)hMetricGroup,pProperties)
    ;
  }
  return hMetricGroup_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupGetProperties(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        zet_metric_group_properties_t* pProperties      ///< [in,out] metric group properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_group_object_t*>( hMetricGroup )->dditable;
        auto pfnGetProperties = dditable->zet.MetricGroup.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricGroup = reinterpret_cast<zet_metric_group_object_t*>( hMetricGroup )->handle;

        // forward to device-driver
        result = pfnGetProperties( hMetricGroup, pProperties );

        return result;
    }